

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimgrb.cpp
# Opt level: O3

ulong __thiscall CVmObjHTTPRequest::rebuild_image(CVmObjHTTPRequest *this,char *buf,ulong buflen)

{
  return 0;
}

Assistant:

ulong CVmObjHTTPRequest::rebuild_image(VMG_ char *buf, ulong buflen)
{
    /* we don't store anything in the image file */
    ulong needlen = 0;

    /* make sure there's room */
    if (needlen > buflen)
        return needlen;

    /* return the length */
    return needlen;
}